

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_setVolume(OpenJTalk *oj,double f)

{
  long in_RDI;
  Open_JTalk *in_XMM0_Qa;
  double in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    *(Open_JTalk **)(in_RDI + 0x668) = in_XMM0_Qa;
    Open_JTalk_set_volume(in_XMM0_Qa,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVolume(OpenJTalk *oj, double f)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	oj->volume = f;
	Open_JTalk_set_volume(oj->open_jtalk, oj->volume);
}